

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O2

bool __thiscall SymmetricAlgorithm::encryptFinal(SymmetricAlgorithm *this,ByteString *param_1)

{
  anon_enum_32 aVar1;
  
  aVar1 = this->currentOperation;
  if (aVar1 == ENCRYPT) {
    this->currentKey = (SymmetricKey *)0x0;
    this->currentCipherMode = Unknown;
    this->currentPaddingMode = true;
    this->currentBufferSize = 0;
    this->currentCounterBits = 0;
    this->currentTagBytes = 0;
    this->currentOperation = NONE;
  }
  return aVar1 == ENCRYPT;
}

Assistant:

bool SymmetricAlgorithm::encryptFinal(ByteString& /*encryptedData*/)
{
	if (currentOperation != ENCRYPT)
	{
		return false;
	}

	currentKey = NULL;
	currentCipherMode = SymMode::Unknown;
	currentPaddingMode = true;
	currentCounterBits = 0;
	currentTagBytes = 0;
	currentOperation = NONE;
	currentBufferSize = 0;

	return true;
}